

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# airport.cpp
# Opt level: O0

void __thiscall Airport::push_ticket(Airport *this,Ticket *obj)

{
  pair<const_unsigned_int,_Ticket> local_80;
  Ticket *local_18;
  Ticket *obj_local;
  Airport *this_local;
  
  local_18 = obj;
  obj_local = (Ticket *)this;
  std::pair<const_unsigned_int,_Ticket>::pair<const_unsigned_int,_Ticket,_true>
            (&local_80,&obj->id,obj);
  std::
  map<unsigned_int,_Ticket,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Ticket>_>_>
  ::insert(&this->tickets,&local_80);
  std::pair<const_unsigned_int,_Ticket>::~pair(&local_80);
  return;
}

Assistant:

void Airport::push_ticket(const Ticket &obj)
{
    tickets.insert({obj.id,obj});
}